

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# torrent_info.cpp
# Opt level: O0

void __thiscall libtorrent::torrent_info::internal_set_creator(torrent_info *this,string_view c)

{
  allocator<char> local_41;
  string local_40 [32];
  torrent_info *local_20;
  torrent_info *this_local;
  string_view c_local;
  
  c_local._M_len = (size_t)c._M_str;
  this_local = (torrent_info *)c._M_len;
  local_20 = this;
  ::std::allocator<char>::allocator();
  ::std::__cxx11::string::string<std::basic_string_view<char,std::char_traits<char>>,void>
            (local_40,(basic_string_view<char,_std::char_traits<char>_> *)&this_local,&local_41);
  ::std::__cxx11::string::operator=((string *)&this->m_created_by,local_40);
  ::std::__cxx11::string::~string(local_40);
  ::std::allocator<char>::~allocator(&local_41);
  return;
}

Assistant:

void torrent_info::internal_set_creator(string_view const c)
	{ m_created_by = std::string(c); }